

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

void __thiscall Tree::createWeightArray(Tree *this)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int local_18;
  int j;
  int i;
  int currWeight;
  Tree *this_local;
  
  _i = this;
  quickSort(this,0,this->m_queueIndexArraySize + -1);
  for (local_18 = 0; j = 1, local_18 < this->m_queueIndexArraySize; local_18 = j + local_18) {
    if ((local_18 != this->m_queueIndexArraySize + -1) &&
       ((this->m_queueIndexArray[local_18]->field_1).data.year ==
        (this->m_queueIndexArray[local_18 + 1]->field_1).data.year)) {
      j = 2;
      iVar1 = local_18;
      while( true ) {
        local_1c = iVar1 + 1;
        bVar2 = false;
        if (local_1c != this->m_queueIndexArraySize + -1) {
          bVar2 = (this->m_queueIndexArray[local_1c]->field_1).data.year ==
                  (this->m_queueIndexArray[iVar1 + 2]->field_1).data.year;
        }
        if (!bVar2) break;
        j = j + 1;
        iVar1 = local_1c;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_weightArray,&j);
  }
  return;
}

Assistant:

void createWeightArray() {
        quickSort(0, m_queueIndexArraySize - 1);
        int currWeight = 1;
        for (int i = 0; i < m_queueIndexArraySize; ++i) {
            if ((i != m_queueIndexArraySize - 1) && (m_queueIndexArray[i]->data.year == m_queueIndexArray[i + 1]->data.year)) {
                currWeight++;
                int j = i + 1;
                while ((j != m_queueIndexArraySize - 1) && (m_queueIndexArray[j]->data.year == m_queueIndexArray[j + 1]->data.year)) {
                    currWeight++;
                    j++;
                }
            }
            m_weightArray.push_back(currWeight);
            i += currWeight - 1;
            currWeight = 1;
        }
    }